

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

uint32_t __thiscall AdsDevice::GetTimeout(AdsDevice *this)

{
  long lVar1;
  AdsException *this_00;
  long error;
  AdsDevice *pAStack_10;
  uint32_t timeout;
  AdsDevice *this_local;
  
  error._4_4_ = 0;
  pAStack_10 = this;
  lVar1 = GetLocalPort(this);
  lVar1 = AdsSyncGetTimeoutEx(lVar1,(uint32_t *)((long)&error + 4));
  if (lVar1 != 0) {
    this_00 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(this_00,lVar1);
    __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
  }
  return error._4_4_;
}

Assistant:

uint32_t AdsDevice::GetTimeout() const
{
    uint32_t timeout = 0;
    const auto error = AdsSyncGetTimeoutEx(GetLocalPort(), &timeout);
    if (error) {
        throw AdsException(error);
    }
    return timeout;
}